

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blackboard.cpp
# Opt level: O0

void __thiscall cali::Blackboard::snapshot(Blackboard *this,SnapshotBuilder *rec)

{
  int iVar1;
  int iVar2;
  uint local_24;
  int j;
  int tmp;
  int i;
  int tmptoc;
  SnapshotBuilder *rec_local;
  Blackboard *this_local;
  
  tmp = this->toctoc;
  while (tmp != 0) {
    iVar1 = anon_unknown.dwarf_2ecdce::first_high_bit(tmp);
    iVar1 = iVar1 + -1;
    tmp = (1 << ((byte)iVar1 & 0x1f) ^ 0xffffffffU) & tmp;
    local_24 = this->toc[iVar1];
    while (local_24 != 0) {
      iVar2 = anon_unknown.dwarf_2ecdce::first_high_bit(local_24);
      local_24 = (1 << ((byte)(iVar2 + -1) & 0x1f) ^ 0xffffffffU) & local_24;
      SnapshotBuilder::append(rec,&this->hashtable[iVar1 * 0x20 + iVar2 + -1].value);
    }
  }
  return;
}

Assistant:

void Blackboard::snapshot(SnapshotBuilder& rec) const
{
    int tmptoc = toctoc;

    while (tmptoc) {
        int i = first_high_bit(tmptoc) - 1;
        tmptoc &= ~(1 << i);

        int tmp = toc[i];
        while (tmp) {
            int j = first_high_bit(tmp) - 1;
            tmp &= ~(1 << j);

            rec.append(hashtable[i * 32 + j].value);
        }
    }
}